

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::dxt_hc::tile_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num * 0x48; lVar1 != 0; lVar1 = lVar1 + -0x48) {
    dxt_hc::tile_details::tile_details((tile_details *)pDst_void,(tile_details *)pSrc_void);
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 0x48);
    pDst_void = (void *)((long)pDst_void + 0x48);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }